

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O2

void ans_fold_decompress<2u>(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  array<unsigned_long,_4UL> states;
  ans_fold_decode<2U> ans_frame;
  undefined1 (*local_a8) [32];
  undefined1 local_a0 [32];
  ans_fold_decode<2U> local_80;
  
  ans_fold_decode<2U>::load(&local_80,cSrc);
  local_a8 = (undefined1 (*) [32])(cSrc + (cSrcSize - 0x20));
  auVar4._8_8_ = local_80.lower_bound;
  auVar4._0_8_ = local_80.lower_bound;
  auVar4._16_8_ = local_80.lower_bound;
  auVar4._24_8_ = local_80.lower_bound;
  uVar2 = to_decode & 0xfffffffffffffffc;
  uVar3 = 0;
  local_a0 = vpaddq_avx2(auVar4,*local_a8);
  for (; uVar2 != uVar3; uVar3 = uVar3 + 4) {
    uVar1 = ans_fold_decode<2U>::decode_sym
                      (&local_80,(uint64_t *)(local_a0 + 0x18),(uint8_t **)&local_a8);
    dst[uVar3] = uVar1;
    uVar1 = ans_fold_decode<2U>::decode_sym
                      (&local_80,(uint64_t *)(local_a0 + 0x10),(uint8_t **)&local_a8);
    dst[uVar3 + 1] = uVar1;
    uVar1 = ans_fold_decode<2U>::decode_sym
                      (&local_80,(uint64_t *)(local_a0 + 8),(uint8_t **)&local_a8);
    dst[uVar3 + 2] = uVar1;
    uVar1 = ans_fold_decode<2U>::decode_sym(&local_80,(uint64_t *)local_a0,(uint8_t **)&local_a8);
    dst[uVar3 + 3] = uVar1;
  }
  for (; to_decode != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = ans_fold_decode<2U>::decode_sym(&local_80,(uint64_t *)local_a0,(uint8_t **)&local_a8);
    dst[uVar2] = uVar1;
  }
  ans_fold_decode<2U>::~ans_fold_decode(&local_80);
  return;
}

Assistant:

void ans_fold_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_fold_decode<fidelity>::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, 4> states;
    states[3] = ans_frame.init_state(in_u8);
    states[2] = ans_frame.init_state(in_u8);
    states[1] = ans_frame.init_state(in_u8);
    states[0] = ans_frame.init_state(in_u8);

    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % 4);
    while (cur_idx != fast_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[3], in_u8);
        out_u32[cur_idx + 1] = ans_frame.decode_sym(states[2], in_u8);
        out_u32[cur_idx + 2] = ans_frame.decode_sym(states[1], in_u8);
        out_u32[cur_idx + 3] = ans_frame.decode_sym(states[0], in_u8);
        cur_idx += 4;
    }
    while (cur_idx != to_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[0], in_u8);
        cur_idx++;
    }
}